

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeField(ParserImpl *this,Message *message)

{
  string *__lhs;
  Finder *pFVar1;
  OneofDescriptor *oneof_descriptor;
  bool bVar2;
  bool bVar3;
  __type _Var4;
  int iVar5;
  Type TVar6;
  CppType CVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Descriptor *pDVar8;
  Descriptor *pDVar9;
  FieldDescriptor *pFVar10;
  MessageFactory *factory;
  LogMessage *other;
  MessageLite *this_00;
  undefined8 extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  FieldDescriptor *pFVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string local_170;
  ParseLocation local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  FieldDescriptor *local_128;
  FieldDescriptor *any_type_url_field;
  FieldDescriptor *any_value_field;
  int32 field_number;
  undefined1 local_f8 [8];
  string field_name;
  undefined1 local_b8 [8];
  string serialized_value;
  undefined1 local_90 [8];
  string full_type_name;
  undefined1 local_58 [8];
  string prefix;
  undefined4 extraout_var_03;
  
  (*(message->super_MessageLite)._vptr_MessageLite[0x13])(message);
  serialized_value.field_2._8_8_ = extraout_RDX;
  iVar5 = (*(message->super_MessageLite)._vptr_MessageLite[0x13])(message);
  pDVar8 = (Descriptor *)CONCAT44(extraout_var,iVar5);
  local_f8 = (undefined1  [8])&field_name._M_string_length;
  field_name._M_dataplus._M_p = (pointer)0x0;
  field_name._M_string_length._0_1_ = 0;
  local_150.line = (this->tokenizer_).current_.line;
  local_150.column = (this->tokenizer_).current_.column;
  bVar2 = internal::GetAnyFieldDescriptors(message,&local_128,&any_type_url_field);
  if (bVar2) {
    std::__cxx11::string::string((string *)local_90,"[",(allocator *)local_58);
    bVar2 = TryConsume(this,(string *)local_90);
    std::__cxx11::string::~string((string *)local_90);
    if (bVar2) {
      local_90 = (undefined1  [8])&full_type_name._M_string_length;
      full_type_name._M_dataplus._M_p = (pointer)0x0;
      full_type_name._M_string_length._0_1_ = 0;
      local_58 = (undefined1  [8])&prefix._M_string_length;
      prefix._M_dataplus._M_p = (pointer)0x0;
      prefix._M_string_length._0_1_ = 0;
      bVar2 = ConsumeAnyTypeUrl(this,(string *)local_90,(string *)local_58);
      if (bVar2) {
        std::__cxx11::string::string
                  ((string *)local_b8,"]",(allocator *)(field_name.field_2._M_local_buf + 8));
        bVar2 = Consume(this,(string *)local_b8);
        std::__cxx11::string::~string((string *)local_b8);
        if (!bVar2) goto LAB_00314f83;
        std::__cxx11::string::string
                  ((string *)local_b8,":",(allocator *)(field_name.field_2._M_local_buf + 8));
        TryConsume(this,(string *)local_b8);
        std::__cxx11::string::~string((string *)local_b8);
        local_b8 = (undefined1  [8])&serialized_value._M_string_length;
        serialized_value._M_dataplus._M_p = (pointer)0x0;
        serialized_value._M_string_length._0_1_ = 0;
        pFVar1 = this->finder_;
        if (pFVar1 == (Finder *)0x0) {
          pDVar8 = anon_unknown_20::DefaultFinderFindAnyType
                             (message,(string *)local_58,(string *)local_90);
        }
        else {
          iVar5 = (*pFVar1->_vptr_Finder[4])(pFVar1,message,local_58,local_90);
          pDVar8 = (Descriptor *)CONCAT44(extraout_var_00,iVar5);
        }
        if (pDVar8 == (Descriptor *)0x0) {
          std::operator+(&local_148,"Could not find type \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_58);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &any_value_field,&local_148,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_90);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&field_name.field_2 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &any_value_field,"\" stored in google.protobuf.Any.");
          ReportError(this,(string *)((long)&field_name.field_2 + 8));
          std::__cxx11::string::~string((string *)(field_name.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)&any_value_field);
          pbVar11 = &local_148;
LAB_00315200:
          std::__cxx11::string::~string((string *)pbVar11);
LAB_00315205:
          bVar2 = false;
        }
        else {
          bVar2 = ConsumeAnyValue(this,pDVar8,(string *)local_b8);
          if (!bVar2) goto LAB_00315205;
          if ((this->singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) &&
             (((*(int *)(local_128 + 0x3c) != 3 &&
               (bVar2 = Reflection::HasField
                                  ((Reflection *)serialized_value.field_2._8_8_,message,local_128),
               bVar2)) ||
              ((*(int *)(any_type_url_field + 0x3c) != 3 &&
               (bVar2 = Reflection::HasField
                                  ((Reflection *)serialized_value.field_2._8_8_,message,
                                   any_type_url_field), bVar2)))))) {
            std::__cxx11::string::string
                      ((string *)(field_name.field_2._M_local_buf + 8),
                       "Non-repeated Any specified multiple times.",(allocator *)&any_value_field);
            ReportError(this,(string *)((long)&field_name.field_2 + 8));
            pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (field_name.field_2._M_local_buf + 8);
            goto LAB_00315200;
          }
          std::operator+(&local_190,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_90);
          Reflection::SetString
                    ((Reflection *)serialized_value.field_2._8_8_,message,local_128,&local_190);
          std::__cxx11::string::~string((string *)&local_190);
          std::__cxx11::string::string((string *)&local_170,(string *)local_b8);
          Reflection::SetString
                    ((Reflection *)serialized_value.field_2._8_8_,message,any_type_url_field,
                     &local_170);
          std::__cxx11::string::~string((string *)&local_170);
          bVar2 = true;
        }
        std::__cxx11::string::~string((string *)local_b8);
      }
      else {
LAB_00314f83:
        bVar2 = false;
      }
      std::__cxx11::string::~string((string *)local_58);
      std::__cxx11::string::~string((string *)local_90);
      goto LAB_00315a9e;
    }
  }
  std::__cxx11::string::string((string *)local_90,"[",(allocator *)local_58);
  bVar2 = TryConsume(this,(string *)local_90);
  std::__cxx11::string::~string((string *)local_90);
  if (!bVar2) {
    bVar2 = ConsumeIdentifier(this,(string *)local_f8);
    if (!bVar2) goto LAB_00315a9b;
    if ((this->allow_field_number_ == true) &&
       (bVar2 = safe_strto32((string *)local_f8,(int32 *)&any_value_field), bVar2)) {
      bVar2 = Descriptor::IsExtensionNumber(pDVar8,(int)any_value_field);
      if (!bVar2) {
        bVar3 = Descriptor::IsReservedNumber(pDVar8,(int)any_value_field);
        bVar2 = true;
        if (!bVar3) {
          prefix.field_2._8_8_ = Descriptor::FindFieldByNumber(pDVar8,(int)any_value_field);
          goto LAB_0031537c;
        }
        goto LAB_0031584e;
      }
      pFVar1 = this->finder_;
      if (pFVar1 == (Finder *)0x0) {
        prefix.field_2._8_8_ =
             anon_unknown_20::DefaultFinderFindExtensionByNumber(pDVar8,(int)any_value_field);
      }
      else {
        iVar5 = (*pFVar1->_vptr_Finder[3])(pFVar1,pDVar8);
        prefix.field_2._8_8_ = CONCAT44(extraout_var_02,iVar5);
      }
LAB_0031537c:
      if ((FieldDescriptor *)prefix.field_2._8_8_ != (FieldDescriptor *)0x0) goto LAB_0031538b;
LAB_003157a3:
      if (this->allow_unknown_field_ != false) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&field_name.field_2 + 8),"Message type \"",
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (pDVar8 + 8));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&field_name.field_2 + 8),"\" has no field named \"");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_b8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8
                      );
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_58,"\".");
        ReportWarning(this,(string *)local_90);
        goto LAB_0031581f;
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&field_name.field_2 + 8),"Message type \"",
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (pDVar8 + 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&field_name.field_2 + 8),"\" has no field named \"");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     "\".");
      ReportError(this,(string *)local_90);
LAB_00315a6e:
      std::__cxx11::string::~string((string *)local_90);
      std::__cxx11::string::~string((string *)local_58);
      std::__cxx11::string::~string((string *)local_b8);
      pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (field_name.field_2._M_local_buf + 8);
LAB_00315a96:
      std::__cxx11::string::~string((string *)pbVar11);
      goto LAB_00315a9b;
    }
    prefix.field_2._8_8_ = Descriptor::FindFieldByName(pDVar8,(string *)local_f8);
    if ((FieldDescriptor *)prefix.field_2._8_8_ == (FieldDescriptor *)0x0) {
      std::__cxx11::string::string((string *)local_90,(string *)local_f8);
      LowerString((string *)local_90);
      pFVar10 = Descriptor::FindFieldByName(pDVar8,(string *)local_90);
      if (pFVar10 == (FieldDescriptor *)0x0) {
        pFVar12 = (FieldDescriptor *)0x0;
      }
      else {
        TVar6 = FieldDescriptor::type(pFVar10);
        pFVar12 = (FieldDescriptor *)0x0;
        if (TVar6 == TYPE_GROUP) {
          pFVar12 = pFVar10;
        }
      }
      std::__cxx11::string::~string((string *)local_90);
      prefix.field_2._8_8_ = pFVar12;
      if (pFVar12 != (FieldDescriptor *)0x0) goto LAB_00315225;
LAB_00315257:
      if (this->allow_case_insensitive_field_ == true) {
        std::__cxx11::string::string((string *)local_90,(string *)local_f8);
        LowerString((string *)local_90);
        pFVar10 = Descriptor::FindFieldByLowercaseName(pDVar8,(string *)local_90);
        std::__cxx11::string::~string((string *)local_90);
        prefix.field_2._8_8_ = pFVar10;
        if (pFVar10 != (FieldDescriptor *)0x0) goto LAB_0031538b;
      }
      bVar3 = Descriptor::IsReservedName(pDVar8,(string *)local_f8);
      bVar2 = true;
      if (bVar3) goto LAB_0031584e;
      goto LAB_003157a3;
    }
LAB_00315225:
    TVar6 = FieldDescriptor::type((FieldDescriptor *)prefix.field_2._8_8_);
    if (TVar6 == TYPE_GROUP) {
      pDVar9 = FieldDescriptor::message_type((FieldDescriptor *)prefix.field_2._8_8_);
      bVar2 = std::operator!=(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **
                               )pDVar9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_f8);
      if (bVar2) goto LAB_00315257;
    }
LAB_0031538b:
    if (this->singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
      if ((*(int *)(prefix.field_2._8_8_ + 0x3c) == 3) ||
         (bVar2 = Reflection::HasField
                            ((Reflection *)serialized_value.field_2._8_8_,message,
                             (FieldDescriptor *)prefix.field_2._8_8_), !bVar2)) {
        oneof_descriptor = *(OneofDescriptor **)(prefix.field_2._8_8_ + 0x58);
        if ((oneof_descriptor == (OneofDescriptor *)0x0) ||
           (bVar2 = Reflection::HasOneof
                              ((Reflection *)serialized_value.field_2._8_8_,message,oneof_descriptor
                              ), !bVar2)) goto LAB_00315529;
        pFVar10 = Reflection::GetOneofFieldDescriptor
                            ((Reflection *)serialized_value.field_2._8_8_,message,oneof_descriptor);
        std::operator+(&local_148,"Field \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8
                      );
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &any_value_field,&local_148,"\" is specified along with field \"");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&field_name.field_2 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &any_value_field,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        pFVar10);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&field_name.field_2 + 8),"\", another member of oneof \"");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_b8,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        oneof_descriptor);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_58,"\".");
        ReportError(this,(string *)local_90);
        std::__cxx11::string::~string((string *)local_90);
        std::__cxx11::string::~string((string *)local_58);
        std::__cxx11::string::~string((string *)local_b8);
        std::__cxx11::string::~string((string *)(field_name.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)&any_value_field);
        pbVar11 = &local_148;
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                       ,"Non-repeated field \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8
                      );
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_58,"\" is specified multiple times.");
        ReportError(this,(string *)local_90);
        std::__cxx11::string::~string((string *)local_90);
        pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58;
      }
      goto LAB_00315a96;
    }
LAB_00315529:
    CVar7 = FieldDescriptor::cpp_type((FieldDescriptor *)prefix.field_2._8_8_);
    if (CVar7 == CPPTYPE_MESSAGE) {
      std::__cxx11::string::string((string *)local_90,":",(allocator *)local_58);
      bVar2 = TryConsume(this,(string *)local_90);
      std::__cxx11::string::~string((string *)local_90);
      if (((!bVar2) || (*(char *)(*(long *)(prefix.field_2._8_8_ + 0x78) + 0x4f) != '\x01')) ||
         ((this->tokenizer_).current_.type != TYPE_STRING)) goto LAB_00315619;
      local_90 = (undefined1  [8])&full_type_name._M_string_length;
      full_type_name._M_dataplus._M_p = (pointer)0x0;
      full_type_name._M_string_length._0_1_ = 0;
      bVar2 = ConsumeString(this,(string *)local_90);
      if (!bVar2) {
        pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90;
        goto LAB_00315a96;
      }
      pFVar1 = this->finder_;
      if (pFVar1 == (Finder *)0x0) {
        factory = (MessageFactory *)0x0;
      }
      else {
        iVar5 = (*pFVar1->_vptr_Finder[5])(pFVar1,prefix.field_2._8_8_);
        factory = (MessageFactory *)CONCAT44(extraout_var_03,iVar5);
      }
      this_00 = &Reflection::MutableMessage
                           ((Reflection *)serialized_value.field_2._8_8_,message,
                            (FieldDescriptor *)prefix.field_2._8_8_,factory)->super_MessageLite;
      MessageLite::ParseFromString(this_00,(string *)local_90);
      std::__cxx11::string::~string((string *)local_90);
    }
    else {
      std::__cxx11::string::string((string *)local_90,":",(allocator *)local_58);
      bVar2 = Consume(this,(string *)local_90);
      std::__cxx11::string::~string((string *)local_90);
      if (!bVar2) goto LAB_00315a9b;
LAB_00315619:
      if (*(int *)(prefix.field_2._8_8_ + 0x3c) == 3) {
        std::__cxx11::string::string((string *)local_90,"[",(allocator *)local_58);
        bVar2 = TryConsume(this,(string *)local_90);
        std::__cxx11::string::~string((string *)local_90);
        if (bVar2) {
          std::__cxx11::string::string((string *)local_90,"]",(allocator *)local_58);
          bVar2 = TryConsume(this,(string *)local_90);
          std::__cxx11::string::~string((string *)local_90);
          if (!bVar2) {
            do {
              CVar7 = FieldDescriptor::cpp_type((FieldDescriptor *)prefix.field_2._8_8_);
              if (CVar7 == CPPTYPE_MESSAGE) {
                bVar2 = ConsumeFieldMessage(this,message,
                                            (Reflection *)serialized_value.field_2._8_8_,
                                            (FieldDescriptor *)prefix.field_2._8_8_);
              }
              else {
                bVar2 = ConsumeFieldValue(this,message,(Reflection *)serialized_value.field_2._8_8_,
                                          (FieldDescriptor *)prefix.field_2._8_8_);
              }
              if (bVar2 == false) goto LAB_00315a9b;
              std::__cxx11::string::string((string *)local_90,"]",(allocator *)local_58);
              bVar2 = TryConsume(this,(string *)local_90);
              std::__cxx11::string::~string((string *)local_90);
              if (bVar2) goto LAB_00315aef;
              std::__cxx11::string::string((string *)local_90,",",(allocator *)local_58);
              bVar3 = Consume(this,(string *)local_90);
              std::__cxx11::string::~string((string *)local_90);
              bVar2 = false;
            } while (bVar3);
            goto LAB_00315a9e;
          }
          goto LAB_00315aef;
        }
      }
      CVar7 = FieldDescriptor::cpp_type((FieldDescriptor *)prefix.field_2._8_8_);
      if (CVar7 == CPPTYPE_MESSAGE) {
        bVar2 = ConsumeFieldMessage(this,message,(Reflection *)serialized_value.field_2._8_8_,
                                    (FieldDescriptor *)prefix.field_2._8_8_);
      }
      else {
        bVar2 = ConsumeFieldValue(this,message,(Reflection *)serialized_value.field_2._8_8_,
                                  (FieldDescriptor *)prefix.field_2._8_8_);
      }
      if (bVar2 == false) goto LAB_00315a9b;
    }
LAB_00315aef:
    std::__cxx11::string::string((string *)local_90,";",(allocator *)local_b8);
    bVar2 = TryConsume(this,(string *)local_90);
    if (!bVar2) {
      std::__cxx11::string::string
                ((string *)local_58,",",(allocator *)(field_name.field_2._M_local_buf + 8));
      TryConsume(this,(string *)local_58);
      std::__cxx11::string::~string((string *)local_58);
    }
    std::__cxx11::string::~string((string *)local_90);
    if (*(char *)(*(long *)(prefix.field_2._8_8_ + 0x78) + 0x4e) == '\x01') {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     "text format contains deprecated field \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     "\"");
      ReportWarning(this,(string *)local_90);
      std::__cxx11::string::~string((string *)local_90);
      std::__cxx11::string::~string((string *)local_58);
    }
    bVar2 = true;
    if (this->parse_info_tree_ != (ParseInfoTree *)0x0) {
      ParseInfoTree::RecordLocation
                (this->parse_info_tree_,(FieldDescriptor *)prefix.field_2._8_8_,local_150);
    }
    goto LAB_00315a9e;
  }
  bVar2 = ConsumeFullTypeName(this,(string *)local_f8);
  if (bVar2) {
    std::__cxx11::string::string((string *)local_90,"]",(allocator *)local_58);
    bVar2 = Consume(this,(string *)local_90);
    std::__cxx11::string::~string((string *)local_90);
    if (bVar2) {
      pFVar1 = this->finder_;
      if (pFVar1 == (Finder *)0x0) {
        prefix.field_2._8_8_ =
             anon_unknown_20::DefaultFinderFindExtension(message,(string *)local_f8);
      }
      else {
        iVar5 = (*pFVar1->_vptr_Finder[2])(pFVar1,message,local_f8);
        prefix.field_2._8_8_ = CONCAT44(extraout_var_01,iVar5);
      }
      if (prefix.field_2._8_8_ != 0) goto LAB_0031538b;
      if ((this->allow_unknown_field_ == false) && (this->allow_unknown_extension_ == false)) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&field_name.field_2 + 8),"Extension \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8
                      );
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&field_name.field_2 + 8),
                       "\" is not defined or is not an extension of \"");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_b8,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (pDVar8 + 8));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_58,"\".");
        ReportError(this,(string *)local_90);
        goto LAB_00315a6e;
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&field_name.field_2 + 8),"Ignoring extension \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&field_name.field_2 + 8),
                     "\" which is not defined or is not an extension of \"");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (pDVar8 + 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     "\".");
      ReportWarning(this,(string *)local_90);
LAB_0031581f:
      std::__cxx11::string::~string((string *)local_90);
      std::__cxx11::string::~string((string *)local_58);
      std::__cxx11::string::~string((string *)local_b8);
      std::__cxx11::string::~string((string *)(field_name.field_2._M_local_buf + 8));
      bVar2 = false;
LAB_0031584e:
      if (((this->allow_unknown_field_ == false) && (!bVar2)) &&
         ((this->allow_unknown_extension_ & 1U) == 0)) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_90,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/text_format.cc"
                   ,0x1fb);
        other = internal::LogMessage::operator<<
                          ((LogMessage *)local_90,
                           "CHECK failed: allow_unknown_field_ || allow_unknown_extension_ || reserved_field: "
                          );
        internal::LogFinisher::operator=((LogFinisher *)local_58,other);
        internal::LogMessage::~LogMessage((LogMessage *)local_90);
      }
      std::__cxx11::string::string
                ((string *)local_90,":",(allocator *)(field_name.field_2._M_local_buf + 8));
      bVar2 = TryConsume(this,(string *)local_90);
      if (bVar2) {
        std::__cxx11::string::string((string *)local_58,"{",(allocator *)&any_value_field);
        __lhs = &(this->tokenizer_).current_.text;
        _Var4 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_58);
        if (_Var4) {
          std::__cxx11::string::~string((string *)local_58);
          goto LAB_0031590b;
        }
        std::__cxx11::string::string((string *)local_b8,"<",(allocator *)&local_148);
        _Var4 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_b8);
        std::__cxx11::string::~string((string *)local_b8);
        std::__cxx11::string::~string((string *)local_58);
        std::__cxx11::string::~string((string *)local_90);
        if (!_Var4) {
          bVar2 = SkipFieldValue(this);
          goto LAB_00315a9e;
        }
      }
      else {
LAB_0031590b:
        std::__cxx11::string::~string((string *)local_90);
      }
      bVar2 = SkipFieldMessage(this);
      goto LAB_00315a9e;
    }
  }
LAB_00315a9b:
  bVar2 = false;
LAB_00315a9e:
  std::__cxx11::string::~string((string *)local_f8);
  return bVar2;
}

Assistant:

bool ConsumeField(Message* message) {
    const Reflection* reflection = message->GetReflection();
    const Descriptor* descriptor = message->GetDescriptor();

    std::string field_name;
    bool reserved_field = false;
    const FieldDescriptor* field = nullptr;
    int start_line = tokenizer_.current().line;
    int start_column = tokenizer_.current().column;

    const FieldDescriptor* any_type_url_field;
    const FieldDescriptor* any_value_field;
    if (internal::GetAnyFieldDescriptors(*message, &any_type_url_field,
                                         &any_value_field) &&
        TryConsume("[")) {
      std::string full_type_name, prefix;
      DO(ConsumeAnyTypeUrl(&full_type_name, &prefix));
      DO(Consume("]"));
      TryConsume(":");  // ':' is optional between message labels and values.
      std::string serialized_value;
      const Descriptor* value_descriptor =
          finder_ ? finder_->FindAnyType(*message, prefix, full_type_name)
                  : DefaultFinderFindAnyType(*message, prefix, full_type_name);
      if (value_descriptor == nullptr) {
        ReportError("Could not find type \"" + prefix + full_type_name +
                    "\" stored in google.protobuf.Any.");
        return false;
      }
      DO(ConsumeAnyValue(value_descriptor, &serialized_value));
      if (singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
        // Fail if any_type_url_field has already been specified.
        if ((!any_type_url_field->is_repeated() &&
             reflection->HasField(*message, any_type_url_field)) ||
            (!any_value_field->is_repeated() &&
             reflection->HasField(*message, any_value_field))) {
          ReportError("Non-repeated Any specified multiple times.");
          return false;
        }
      }
      reflection->SetString(message, any_type_url_field,
                            std::string(prefix + full_type_name));
      reflection->SetString(message, any_value_field, serialized_value);
      return true;
    }
    if (TryConsume("[")) {
      // Extension.
      DO(ConsumeFullTypeName(&field_name));
      DO(Consume("]"));

      field = finder_ ? finder_->FindExtension(message, field_name)
                      : DefaultFinderFindExtension(message, field_name);

      if (field == nullptr) {
        if (!allow_unknown_field_ && !allow_unknown_extension_) {
          ReportError("Extension \"" + field_name +
                      "\" is not defined or "
                      "is not an extension of \"" +
                      descriptor->full_name() + "\".");
          return false;
        } else {
          ReportWarning("Ignoring extension \"" + field_name +
                        "\" which is not defined or is not an extension of \"" +
                        descriptor->full_name() + "\".");
        }
      }
    } else {
      DO(ConsumeIdentifier(&field_name));

      int32 field_number;
      if (allow_field_number_ &&
          safe_strto32(field_name, &field_number)) {
        if (descriptor->IsExtensionNumber(field_number)) {
          field = finder_
                      ? finder_->FindExtensionByNumber(descriptor, field_number)
                      : DefaultFinderFindExtensionByNumber(descriptor,
                                                           field_number);
        } else if (descriptor->IsReservedNumber(field_number)) {
          reserved_field = true;
        } else {
          field = descriptor->FindFieldByNumber(field_number);
        }
      } else {
        field = descriptor->FindFieldByName(field_name);
        // Group names are expected to be capitalized as they appear in the
        // .proto file, which actually matches their type names, not their
        // field names.
        if (field == nullptr) {
          std::string lower_field_name = field_name;
          LowerString(&lower_field_name);
          field = descriptor->FindFieldByName(lower_field_name);
          // If the case-insensitive match worked but the field is NOT a group,
          if (field != nullptr &&
              field->type() != FieldDescriptor::TYPE_GROUP) {
            field = nullptr;
          }
        }
        // Again, special-case group names as described above.
        if (field != nullptr && field->type() == FieldDescriptor::TYPE_GROUP &&
            field->message_type()->name() != field_name) {
          field = nullptr;
        }

        if (field == nullptr && allow_case_insensitive_field_) {
          std::string lower_field_name = field_name;
          LowerString(&lower_field_name);
          field = descriptor->FindFieldByLowercaseName(lower_field_name);
        }

        if (field == nullptr) {
          reserved_field = descriptor->IsReservedName(field_name);
        }
      }

      if (field == nullptr && !reserved_field) {
        if (!allow_unknown_field_) {
          ReportError("Message type \"" + descriptor->full_name() +
                      "\" has no field named \"" + field_name + "\".");
          return false;
        } else {
          ReportWarning("Message type \"" + descriptor->full_name() +
                        "\" has no field named \"" + field_name + "\".");
        }
      }
    }

    // Skips unknown or reserved fields.
    if (field == nullptr) {
      GOOGLE_CHECK(allow_unknown_field_ || allow_unknown_extension_ || reserved_field);

      // Try to guess the type of this field.
      // If this field is not a message, there should be a ":" between the
      // field name and the field value and also the field value should not
      // start with "{" or "<" which indicates the beginning of a message body.
      // If there is no ":" or there is a "{" or "<" after ":", this field has
      // to be a message or the input is ill-formed.
      if (TryConsume(":") && !LookingAt("{") && !LookingAt("<")) {
        return SkipFieldValue();
      } else {
        return SkipFieldMessage();
      }
    }

    if (singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
      // Fail if the field is not repeated and it has already been specified.
      if (!field->is_repeated() && reflection->HasField(*message, field)) {
        ReportError("Non-repeated field \"" + field_name +
                    "\" is specified multiple times.");
        return false;
      }
      // Fail if the field is a member of a oneof and another member has already
      // been specified.
      const OneofDescriptor* oneof = field->containing_oneof();
      if (oneof != nullptr && reflection->HasOneof(*message, oneof)) {
        const FieldDescriptor* other_field =
            reflection->GetOneofFieldDescriptor(*message, oneof);
        ReportError("Field \"" + field_name +
                    "\" is specified along with "
                    "field \"" +
                    other_field->name() +
                    "\", another member "
                    "of oneof \"" +
                    oneof->name() + "\".");
        return false;
      }
    }

    // Perform special handling for embedded message types.
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      // ':' is optional here.
      bool consumed_semicolon = TryConsume(":");
      if (consumed_semicolon && field->options().weak() &&
          LookingAtType(io::Tokenizer::TYPE_STRING)) {
        // we are getting a bytes string for a weak field.
        std::string tmp;
        DO(ConsumeString(&tmp));
        MessageFactory* factory =
            finder_ ? finder_->FindExtensionFactory(field) : nullptr;
        reflection->MutableMessage(message, field, factory)
            ->ParseFromString(tmp);
        goto label_skip_parsing;
      }
    } else {
      // ':' is required here.
      DO(Consume(":"));
    }

    if (field->is_repeated() && TryConsume("[")) {
      // Short repeated format, e.g.  "foo: [1, 2, 3]".
      if (!TryConsume("]")) {
        // "foo: []" is treated as empty.
        while (true) {
          if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
            // Perform special handling for embedded message types.
            DO(ConsumeFieldMessage(message, reflection, field));
          } else {
            DO(ConsumeFieldValue(message, reflection, field));
          }
          if (TryConsume("]")) {
            break;
          }
          DO(Consume(","));
        }
      }
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      DO(ConsumeFieldMessage(message, reflection, field));
    } else {
      DO(ConsumeFieldValue(message, reflection, field));
    }
  label_skip_parsing:
    // For historical reasons, fields may optionally be separated by commas or
    // semicolons.
    TryConsume(";") || TryConsume(",");

    if (field->options().deprecated()) {
      ReportWarning("text format contains deprecated field \"" + field_name +
                    "\"");
    }

    // If a parse info tree exists, add the location for the parsed
    // field.
    if (parse_info_tree_ != nullptr) {
      RecordLocation(parse_info_tree_, field,
                     ParseLocation(start_line, start_column));
    }

    return true;
  }